

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# from_decimal.hpp
# Opt level: O1

char duckdb::TryCastDecimalCInternal<signed_char>(duckdb_result *source,idx_t col,idx_t row)

{
  bool bVar1;
  char cVar2;
  undefined8 in_RAX;
  char result_value;
  char local_1;
  
  local_1 = (char)((ulong)in_RAX >> 0x38);
  bVar1 = CastDecimalCInternal<signed_char>(source,&local_1,col,row);
  cVar2 = '\0';
  if (bVar1) {
    cVar2 = local_1;
  }
  return cVar2;
}

Assistant:

RESULT_TYPE TryCastDecimalCInternal(duckdb_result *source, idx_t col, idx_t row) {
	RESULT_TYPE result_value;
	try {
		if (!CastDecimalCInternal<RESULT_TYPE>(source, result_value, col, row)) {
			return FetchDefaultValue::Operation<RESULT_TYPE>();
		}
	} catch (...) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	return result_value;
}